

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

CandidateVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature
          (CandidateVector *__return_storage_ptr__,Feature feature)

{
  Candidate *pCVar1;
  undefined8 uVar2;
  Candidate CVar3;
  Candidate CVar4;
  Candidate CVar5;
  Candidate CVar6;
  
  switch(feature) {
  case SubgroupMask:
  case SubgroupBallot:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,3);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    uVar2 = 0x500000000;
    break;
  case SubgroupSize:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,4);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    CVar3 = KHR_shader_subgroup_basic;
    CVar4 = NV_shader_thread_group;
    CVar5 = AMD_gcn_shader;
    CVar6 = ARB_shader_ballot;
    goto LAB_00226d64;
  case SubgroupInvocationID:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,3);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    uVar2 = 0x500000001;
    break;
  case SubgroupID:
  case NumSubgroups:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,2);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    uVar2 = 0x500000001;
    goto LAB_00226b24;
  case SubgroupBroadcast_First:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,3);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    uVar2 = 0x600000000;
    break;
  case SubgroupBallotFindLSB_MSB:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,2);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    uVar2 = 0x500000000;
    goto LAB_00226b24;
  case SubgroupAll_Any_AllEqualBool:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,4);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    CVar3 = KHR_shader_subgroup_vote;
    CVar4 = NV_gpu_shader_5;
    CVar5 = ARB_shader_group_vote;
    CVar6 = AMD_gcn_shader;
    goto LAB_00226d64;
  default:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    return __return_storage_ptr__;
  case SubgroupBarrier:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,4);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    CVar3 = KHR_shader_subgroup_basic;
    CVar4 = NV_shader_thread_group;
    CVar5 = ARB_shader_ballot;
    CVar6 = AMD_gcn_shader;
LAB_00226d64:
    *pCVar1 = CVar3;
    pCVar1[1] = CVar4;
    pCVar1[2] = CVar5;
    pCVar1[3] = CVar6;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 4;
    return __return_storage_ptr__;
  case SubgroupMemBarrier:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,1);
    *(__return_storage_ptr__->
     super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         KHR_shader_subgroup_basic;
    goto LAB_00226c81;
  case SubgroupBallotBitExtract:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,1);
    *(__return_storage_ptr__->
     super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         NV_shader_thread_group;
LAB_00226c81:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 1;
    return __return_storage_ptr__;
  case SubgroupArithmeticIAddReduce:
  case SubgroupArithmeticIAddExclusiveScan:
  case SubgroupArithmeticIAddInclusiveScan:
  case SubgroupArithmeticFAddReduce:
  case SubgroupArithmeticFAddExclusiveScan:
  case SubgroupArithmeticFAddInclusiveScan:
  case SubgroupArithmeticIMulReduce:
  case SubgroupArithmeticIMulExclusiveScan:
  case SubgroupArithmeticIMulInclusiveScan:
  case SubgroupArithmeticFMulReduce:
  case SubgroupArithmeticFMulExclusiveScan:
  case SubgroupArithmeticFMulInclusiveScan:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::reserve
              (__return_storage_ptr__,2);
    pCVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
             ptr;
    uVar2 = 0x600000003;
LAB_00226b24:
    *(undefined8 *)pCVar1 = uVar2;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 2;
    return __return_storage_ptr__;
  }
  *(undefined8 *)pCVar1 = uVar2;
  pCVar1[2] = ARB_shader_ballot;
  (__return_storage_ptr__->
  super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size =
       3;
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::CandidateVector CompilerGLSL::ShaderSubgroupSupportHelper::
    get_candidates_for_feature(Feature feature)
{
	switch (feature)
	{
	case SubgroupMask:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupSize:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, AMD_gcn_shader, ARB_shader_ballot };
	case SubgroupInvocationID:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupID:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group };
	case NumSubgroups:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group };
	case SubgroupBroadcast_First:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_shuffle, ARB_shader_ballot };
	case SubgroupBallotFindLSB_MSB:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group };
	case SubgroupAll_Any_AllEqualBool:
		return { KHR_shader_subgroup_vote, NV_gpu_shader_5, ARB_shader_group_vote, AMD_gcn_shader };
	case SubgroupAllEqualT:
		return {}; // depends on other features only
	case SubgroupElect:
		return {}; // depends on other features only
	case SubgroupBallot:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupBarrier:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, ARB_shader_ballot, AMD_gcn_shader };
	case SubgroupMemBarrier:
		return { KHR_shader_subgroup_basic };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return {};
	case SubgroupBallotBitExtract:
		return { NV_shader_thread_group };
	case SubgroupBallotBitCount:
		return {};
	case SubgroupArithmeticIAddReduce:
	case SubgroupArithmeticIAddExclusiveScan:
	case SubgroupArithmeticIAddInclusiveScan:
	case SubgroupArithmeticFAddReduce:
	case SubgroupArithmeticFAddExclusiveScan:
	case SubgroupArithmeticFAddInclusiveScan:
	case SubgroupArithmeticIMulReduce:
	case SubgroupArithmeticIMulExclusiveScan:
	case SubgroupArithmeticIMulInclusiveScan:
	case SubgroupArithmeticFMulReduce:
	case SubgroupArithmeticFMulExclusiveScan:
	case SubgroupArithmeticFMulInclusiveScan:
		return { KHR_shader_subgroup_arithmetic, NV_shader_thread_shuffle };
	default:
		return {};
	}
}